

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O0

int sftp_cmd_cd(sftp_command *cmd)

{
  sftp_request *psVar1;
  sftp_packet *psVar2;
  fxp_handle *handle;
  char *pcVar3;
  char *local_48;
  char *san_1;
  char *san;
  char *dir;
  sftp_request *req;
  sftp_packet *pktin;
  fxp_handle *dirh;
  sftp_command *cmd_local;
  
  if (backend == (Backend *)0x0) {
    not_connected();
    cmd_local._4_4_ = 0;
  }
  else {
    if (cmd->nwords < 2) {
      san = dupstr(homedir);
    }
    else {
      san = canonify(cmd->words[1]);
    }
    psVar1 = fxp_opendir_send(san);
    psVar2 = sftp_wait_for_reply(psVar1);
    handle = fxp_opendir_recv(psVar2,psVar1);
    if (handle == (fxp_handle *)0x0) {
      san_1 = stripctrl_string(string_scc,san);
      while (san_1 != (char *)0x0) {
        pcVar3 = fxp_error();
        printf("Directory %s: %s\n",san_1,pcVar3);
        safefree(san_1);
        san_1 = (char *)0x0;
      }
      safefree(san);
      cmd_local._4_4_ = 0;
    }
    else {
      psVar1 = fxp_close_send(handle);
      psVar2 = sftp_wait_for_reply(psVar1);
      fxp_close_recv(psVar2,psVar1);
      safefree(pwd);
      pwd = san;
      local_48 = stripctrl_string(string_scc,san);
      while (local_48 != (char *)0x0) {
        printf("Remote directory is now %s\n",local_48);
        safefree(local_48);
        local_48 = (char *)0x0;
      }
      cmd_local._4_4_ = 1;
    }
  }
  return cmd_local._4_4_;
}

Assistant:

int sftp_cmd_cd(struct sftp_command *cmd)
{
    struct fxp_handle *dirh;
    struct sftp_packet *pktin;
    struct sftp_request *req;
    char *dir;

    if (!backend) {
        not_connected();
        return 0;
    }

    if (cmd->nwords < 2)
        dir = dupstr(homedir);
    else {
        dir = canonify(cmd->words[1]);
    }

    req = fxp_opendir_send(dir);
    pktin = sftp_wait_for_reply(req);
    dirh = fxp_opendir_recv(pktin, req);

    if (!dirh) {
        with_stripctrl(san, dir)
            printf("Directory %s: %s\n", san, fxp_error());
        sfree(dir);
        return 0;
    }

    req = fxp_close_send(dirh);
    pktin = sftp_wait_for_reply(req);
    fxp_close_recv(pktin, req);

    sfree(pwd);
    pwd = dir;
    with_stripctrl(san, pwd)
        printf("Remote directory is now %s\n", san);

    return 1;
}